

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O3

void __thiscall
xmrig::Workers<xmrig::CudaLaunchData>::start
          (Workers<xmrig::CudaLaunchData> *this,
          vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *data)

{
  pointer *pppTVar1;
  pointer pCVar2;
  iterator __position;
  IBackend *pIVar3;
  pointer ppTVar4;
  Thread<xmrig::CudaLaunchData> *pTVar5;
  CudaDevice *pCVar6;
  int64_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  undefined4 uVar13;
  Hashrate *this_00;
  pointer ppTVar14;
  CudaLaunchData *item;
  pointer pCVar15;
  Thread<xmrig::CudaLaunchData> *local_48;
  Thread<xmrig::CudaLaunchData> *local_40;
  thread local_38;
  
  pCVar2 = (data->super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar15 = (data->
                 super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>).
                 _M_impl.super__Vector_impl_data._M_start; pCVar15 != pCVar2; pCVar15 = pCVar15 + 1)
  {
    local_48 = (Thread<xmrig::CudaLaunchData> *)operator_new(0x50);
    __position._M_current =
         (this->m_workers).
         super__Vector_base<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pIVar3 = this->d_ptr->backend;
    local_48->m_id =
         (long)__position._M_current -
         (long)(this->m_workers).
               super__Vector_base<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    pCVar6 = pCVar15->device;
    iVar8 = (pCVar15->thread).m_blocks;
    iVar9 = (pCVar15->thread).m_threads;
    iVar7 = (pCVar15->thread).m_affinity;
    uVar10 = (pCVar15->thread).m_index;
    uVar11 = (pCVar15->thread).m_bfactor;
    uVar12 = (pCVar15->thread).m_bsleep;
    uVar13 = *(undefined4 *)&(pCVar15->thread).field_0x1c;
    (local_48->m_config).miner = pCVar15->miner;
    (local_48->m_config).device = pCVar6;
    (local_48->m_config).thread.m_blocks = iVar8;
    (local_48->m_config).thread.m_threads = iVar9;
    (local_48->m_config).thread.m_affinity = iVar7;
    (local_48->m_config).thread.m_index = uVar10;
    (local_48->m_config).thread.m_bfactor = uVar11;
    (local_48->m_config).thread.m_bsleep = uVar12;
    *(undefined4 *)&(local_48->m_config).thread.field_0x1c = uVar13;
    local_48->m_backend = pIVar3;
    local_48->m_worker = (IWorker *)0x0;
    (local_48->m_thread)._M_id._M_thread = 0;
    if (__position._M_current ==
        (this->m_workers).
        super__Vector_base<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<xmrig::Thread<xmrig::CudaLaunchData>*,std::allocator<xmrig::Thread<xmrig::CudaLaunchData>*>>
      ::_M_realloc_insert<xmrig::Thread<xmrig::CudaLaunchData>*>
                ((vector<xmrig::Thread<xmrig::CudaLaunchData>*,std::allocator<xmrig::Thread<xmrig::CudaLaunchData>*>>
                  *)this,__position,&local_48);
    }
    else {
      *__position._M_current = local_48;
      pppTVar1 = &(this->m_workers).
                  super__Vector_base<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
  }
  this_00 = (Hashrate *)operator_new(0x20);
  Hashrate::Hashrate(this_00,(long)(this->m_workers).
                                   super__Vector_base<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_workers).
                                   super__Vector_base<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  this->d_ptr->hashrate = this_00;
  LOCK();
  DAT_001aee50 = DAT_001aee50 + 1;
  UNLOCK();
  ppTVar14 = (this->m_workers).
             super__Vector_base<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppTVar4 = (this->m_workers).
            super__Vector_base<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar14 != ppTVar4) {
    do {
      pTVar5 = *ppTVar14;
      local_48 = (Thread<xmrig::CudaLaunchData> *)onReady;
      local_40 = pTVar5;
      std::thread::thread<void(*&)(void*),xmrig::Thread<xmrig::CudaLaunchData>*,void>
                (&local_38,(_func_void_void_ptr **)&local_48,&local_40);
      if ((pTVar5->m_thread)._M_id._M_thread != 0) {
        std::terminate();
      }
      (pTVar5->m_thread)._M_id._M_thread = (native_handle_type)local_38._M_id._M_thread;
      ppTVar14 = ppTVar14 + 1;
    } while (ppTVar14 != ppTVar4);
  }
  return;
}

Assistant:

void xmrig::Workers<T>::start(const std::vector<T> &data)
{
    for (const T &item : data) {
        m_workers.push_back(new Thread<T>(d_ptr->backend, m_workers.size(), item));
    }

    d_ptr->hashrate = new Hashrate(m_workers.size());
    Nonce::touch(T::backend());

    for (Thread<T> *worker : m_workers) {
        worker->start(Workers<T>::onReady);
    }
}